

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O3

REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,char *mode)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_ADAPT pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  REF_MPI pRVar11;
  undefined8 uVar12;
  char *pcVar13;
  int iVar14;
  REF_INT nnode;
  REF_DBL min_quality;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL min_normdev;
  REF_EDGE ref_edge;
  REF_DBL ratio;
  REF_DBL quality;
  REF_INT part;
  REF_DBL normdev;
  REF_DBL delta;
  REF_INT nodes [27];
  double local_120;
  int local_114;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  REF_MPI local_e8;
  REF_EDGE local_e0;
  double local_d8;
  double local_d0;
  int local_c4;
  double local_c0;
  char *local_b8;
  REF_DBL local_b0;
  REF_INT local_a8 [30];
  
  lVar6 = 0x28;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    lVar6 = 0x50;
  }
  pRVar1 = ref_grid->node;
  pRVar2 = *(REF_CELL *)((long)ref_grid->cell + lVar6 + -0x10);
  local_110 = 1.0;
  pRVar11 = ref_grid->mpi;
  local_b8 = mode;
  if (0 < pRVar2->max) {
    iVar14 = 0;
    local_e8 = ref_grid->mpi;
    do {
      RVar4 = ref_cell_nodes(pRVar2,iVar14,local_a8);
      if (RVar4 == 0) {
        if (ref_grid->twod == 0) {
          if (ref_grid->surf == 0) {
            uVar5 = ref_node_tet_quality(ref_grid->node,local_a8,&local_d0);
            if (uVar5 != 0) {
              pcVar13 = "qual";
              uVar9 = 0x192;
              goto LAB_00158301;
            }
          }
          else {
            uVar5 = ref_node_tri_quality(ref_grid->node,local_a8,&local_d0);
            if (uVar5 != 0) {
              pcVar13 = "qual";
              uVar9 = 399;
              goto LAB_00158301;
            }
          }
        }
        else {
          uVar5 = ref_node_tri_quality(ref_grid->node,local_a8,&local_d0);
          if (uVar5 != 0) {
            pcVar13 = "qual";
            uVar9 = 0x18c;
            goto LAB_00158301;
          }
        }
        if (local_d0 <= local_110) {
          local_110 = local_d0;
        }
      }
      iVar14 = iVar14 + 1;
      pRVar11 = local_e8;
    } while (iVar14 < pRVar2->max);
  }
  local_d0 = local_110;
  uVar5 = ref_mpi_min(pRVar11,&local_d0,&local_110,3);
  if (uVar5 == 0) {
    uVar5 = ref_mpi_bcast(pRVar11,&local_d0,1,3);
    if (uVar5 == 0) {
      local_114 = 0;
      if (0 < (long)pRVar1->max) {
        uVar8 = 0;
        iVar14 = 0;
        do {
          if ((-1 < pRVar1->global[uVar8]) && (pRVar1->ref_mpi->id == pRVar1->part[uVar8])) {
            iVar14 = iVar14 + 1;
            local_114 = iVar14;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(long)pRVar1->max);
      }
      uVar5 = ref_mpi_allsum(pRVar11,&local_114,1,1);
      if (uVar5 == 0) {
        local_f0 = 2.0;
        local_e8 = pRVar11;
        if (((ref_grid->geom->model == (void *)0x0) && (ref_grid->geom->meshlink == (void *)0x0)) ||
           (pRVar2 = ref_grid->cell[3], pRVar2->max < 1)) {
          local_120 = 2.0;
        }
        else {
          iVar14 = 0;
          local_120 = 2.0;
          do {
            RVar4 = ref_cell_nodes(pRVar2,iVar14,local_a8);
            if (RVar4 == 0) {
              uVar5 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_c0);
              if (uVar5 != 0) {
                pcVar13 = "norm dev";
                uVar9 = 0x1a7;
                goto LAB_00158301;
              }
              local_f0 = local_120;
              if (local_c0 <= local_120) {
                local_120 = local_c0;
                local_f0 = local_c0;
              }
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < pRVar2->max);
        }
        pRVar11 = local_e8;
        local_c0 = local_120;
        uVar5 = ref_mpi_min(local_e8,&local_c0,&local_f0,3);
        if (uVar5 == 0) {
          uVar5 = ref_mpi_bcast(pRVar11,&local_f0,1,3);
          if (uVar5 == 0) {
            local_f8 = 1e+200;
            local_100 = -1e+200;
            uVar5 = ref_edge_create(&local_e0,ref_grid);
            if (uVar5 == 0) {
              if (local_e0->n < 1) {
                local_120 = 1e+200;
                local_108 = -1e+200;
              }
              else {
                local_120 = 1e+200;
                local_108 = -1e+200;
                lVar6 = 0;
                do {
                  uVar5 = ref_edge_part(local_e0,(REF_INT)lVar6,&local_c4);
                  if (uVar5 != 0) {
                    pcVar13 = "edge part";
                    uVar9 = 0x1b3;
                    goto LAB_00158301;
                  }
                  if (local_c4 == ref_grid->mpi->id) {
                    uVar5 = ref_node_ratio(ref_grid->node,local_e0->e2n[lVar6 * 2],
                                           local_e0->e2n[lVar6 * 2 + 1],&local_d8);
                    if (uVar5 != 0) {
                      pcVar13 = "rat";
                      uVar9 = 0x1b8;
                      goto LAB_00158301;
                    }
                    if (local_d8 <= local_120) {
                      local_120 = local_d8;
                    }
                    local_100 = local_108;
                    local_f8 = local_120;
                    if (local_108 <= local_d8) {
                      local_108 = local_d8;
                      local_100 = local_d8;
                    }
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < local_e0->n);
              }
              uVar5 = ref_edge_free(local_e0);
              if (uVar5 == 0) {
                local_d8 = local_120;
                uVar5 = ref_mpi_min(pRVar11,&local_d8,&local_f8,3);
                if (uVar5 == 0) {
                  uVar5 = ref_mpi_bcast(pRVar11,&local_f8,1,3);
                  if (uVar5 == 0) {
                    local_d8 = local_108;
                    uVar5 = ref_mpi_max(pRVar11,&local_d8,&local_100,3);
                    if (uVar5 == 0) {
                      uVar5 = ref_mpi_bcast(pRVar11,&local_100,1,3);
                      if (uVar5 == 0) {
                        uVar5 = ref_mpi_stopwatch_delta(pRVar11,&local_b0);
                        if (uVar5 == 0) {
                          if (ref_grid->mpi->id != 0) {
                            return 0;
                          }
                          pRVar3 = ref_grid->adapt;
                          uVar9 = 0x20;
                          if (local_110 < pRVar3->smooth_min_quality) {
                            uVar9 = 0x2a;
                          }
                          uVar10 = 0x20;
                          if (local_f8 < pRVar3->post_min_ratio) {
                            uVar10 = 0x2a;
                          }
                          uVar7 = 0x20;
                          if (pRVar3->post_max_ratio <= local_100 &&
                              local_100 != pRVar3->post_max_ratio) {
                            uVar7 = 0x2a;
                          }
                          uVar12 = 0x20;
                          if (local_f0 < pRVar3->post_min_normdev) {
                            uVar12 = 0x2a;
                          }
                          printf("mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec %5s n %d\n"
                                 ,uVar9,uVar10,uVar7,uVar12,local_b8,local_114);
                          return 0;
                        }
                        pcVar13 = "time delta";
                        uVar9 = 0x1c5;
                      }
                      else {
                        pcVar13 = "max";
                        uVar9 = 0x1c3;
                      }
                    }
                    else {
                      pcVar13 = "mpi max";
                      uVar9 = 0x1c2;
                    }
                  }
                  else {
                    pcVar13 = "min";
                    uVar9 = 0x1c0;
                  }
                }
                else {
                  pcVar13 = "mpi min";
                  uVar9 = 0x1bf;
                }
              }
              else {
                pcVar13 = "free edge";
                uVar9 = 0x1bd;
              }
            }
            else {
              pcVar13 = "make edges";
              uVar9 = 0x1b1;
            }
          }
          else {
            pcVar13 = "min";
            uVar9 = 0x1ad;
          }
        }
        else {
          pcVar13 = "mpi max";
          uVar9 = 0x1ac;
        }
      }
      else {
        pcVar13 = "int sum";
        uVar9 = 0x1a0;
      }
    }
    else {
      pcVar13 = "min";
      uVar9 = 0x198;
    }
  }
  else {
    pcVar13 = "min";
    uVar9 = 0x197;
  }
LAB_00158301:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar9,
         "ref_adapt_tattle",(ulong)uVar5,pcVar13);
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,
                                           const char *mode) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_INT node, nnode;
  REF_DBL ratio, min_ratio, max_ratio, delta;
  REF_INT edge, part;
  REF_EDGE ref_edge;
  char is_ok = ' ';
  char not_ok = '*';
  char quality_met, short_met, long_met, normdev_met;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else if (ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    }
    min_quality = MIN(min_quality, quality);
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  RSS(ref_mpi_stopwatch_delta(ref_mpi, &delta), "time delta");

  if (ref_grid_once(ref_grid)) {
    quality_met = is_ok;
    short_met = is_ok;
    long_met = is_ok;
    normdev_met = is_ok;
    if (min_quality < ref_grid_adapt(ref_grid, smooth_min_quality))
      quality_met = not_ok;
    if (min_ratio < ref_grid_adapt(ref_grid, post_min_ratio))
      short_met = not_ok;
    if (max_ratio > ref_grid_adapt(ref_grid, post_max_ratio)) long_met = not_ok;
    if (min_normdev < ref_grid_adapt(ref_grid, post_min_normdev))
      normdev_met = not_ok;

    printf(
        "mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec "
        "%5s n %d\n",
        quality_met, min_quality, short_met, min_ratio, max_ratio, long_met,
        min_normdev, normdev_met, delta, mode, nnode);
  }

  return REF_SUCCESS;
}